

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratedFileStream.cxx
# Opt level: O3

void __thiscall
cmGeneratedFileStream::cmGeneratedFileStream(cmGeneratedFileStream *this,Encoding encoding)

{
  codecvt *this_00;
  locale local_40;
  locale local_38;
  locale local_30;
  
  std::ios_base::ios_base((ios_base *)&(this->super_ofstream).field_0x140);
  *(undefined **)&(this->super_ofstream).field_0x140 = &std::runtime_error::typeinfo;
  *(undefined8 *)&this->field_0x218 = 0;
  *(undefined2 *)&this->field_0x220 = 0;
  *(undefined8 *)&this->field_0x228 = 0;
  *(undefined8 *)&this->field_0x230 = 0;
  *(undefined8 *)&this->field_0x238 = 0;
  *(undefined8 *)&this->field_0x240 = 0;
  *(undefined1 **)
   &(this->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8 =
       &(this->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0x108;
  *(undefined8 *)
   &(this->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0x100 = 0;
  (this->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0x108 = 0;
  *(undefined1 **)&(this->super_ofstream).field_0x118 = &(this->super_ofstream).field_0x128;
  *(undefined8 *)&(this->super_ofstream).field_0x120 = 0;
  (this->super_ofstream).field_0x128 = 0;
  *(undefined4 *)&(this->super_ofstream).field_0x138 = 0x1000000;
  std::ofstream::ofstream(this);
  (this->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)&PTR__cmGeneratedFileStream_00623d80;
  *(undefined ***)&(this->super_ofstream).field_0x140 = &PTR__cmGeneratedFileStream_00623da8;
  if (encoding != None) {
    std::locale::locale(&local_40,(locale *)&this->field_0x210);
    this_00 = (codecvt *)operator_new(0x20);
    codecvt::codecvt(this_00,encoding);
    std::locale::locale<codecvt>(&local_38,&local_40,this_00);
    std::ios::imbue(&local_30);
    std::locale::~locale(&local_30);
    std::locale::~locale(&local_38);
    std::locale::~locale(&local_40);
  }
  return;
}

Assistant:

cmGeneratedFileStream::cmGeneratedFileStream(Encoding encoding)
{
#ifdef CMAKE_BUILD_WITH_CMAKE
  if (encoding != codecvt::None) {
    imbue(std::locale(getloc(), new codecvt(encoding)));
  }
#else
  static_cast<void>(encoding);
#endif
}